

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::SearchAppBundlePrefix(cmFindPackageCommand *this,string *prefix_in)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  cmFileList *pcVar4;
  bool bVar5;
  allocator<char> local_2b1;
  string local_2b0;
  cmFileListGeneratorCaseInsensitive local_290;
  allocator<char> local_259;
  string local_258;
  cmFileListGeneratorFixed local_238;
  cmFileListGeneratorMacProject local_208;
  string local_1d0;
  cmFileListGeneratorFixed local_1b0;
  undefined1 local_180 [8];
  cmFindPackageFileList lister_1;
  string local_150;
  cmFileListGeneratorFixed local_130;
  cmFileListGeneratorMacProject local_100;
  string local_c8;
  cmFileListGeneratorFixed local_a8;
  undefined1 local_68 [8];
  cmFindPackageFileList lister;
  string prefix;
  string *prefix_in_local;
  cmFindPackageCommand *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  bVar5 = false;
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    bVar5 = *pcVar2 == '/';
  }
  __stream = _stderr;
  if (bVar5) {
    if ((this->DebugMode & 1U) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"Checking bundle prefix [%s]\n",uVar3);
    }
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&lister.UseSuffixes,(ulong)prefix_in);
    cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_68,this,true);
    std::__cxx11::string::string((string *)&local_c8,(string *)&lister.UseSuffixes);
    cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_a8,&local_c8);
    pcVar4 = cmFileList::operator/((cmFileList *)local_68,&local_a8.super_cmFileListGeneratorBase);
    cmFileListGeneratorMacProject::cmFileListGeneratorMacProject(&local_100,&this->Names,".app");
    pcVar4 = cmFileList::operator/(pcVar4,&local_100.super_cmFileListGeneratorBase);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"Contents/Resources",(allocator<char> *)&lister_1.field_0x27);
    cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_130,&local_150);
    cmFileList::operator/(pcVar4,&local_130.super_cmFileListGeneratorBase);
    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&lister_1.field_0x27);
    cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_100);
    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_68);
    if (lister_1.UseSuffixes) {
      this_local._7_1_ = 1;
    }
    lister_1._33_3_ = 0;
    cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_68);
    if (lister_1._32_4_ == 0) {
      cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_180,this,true);
      std::__cxx11::string::string((string *)&local_1d0,(string *)&lister.UseSuffixes);
      cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_1b0,&local_1d0);
      pcVar4 = cmFileList::operator/
                         ((cmFileList *)local_180,&local_1b0.super_cmFileListGeneratorBase);
      cmFileListGeneratorMacProject::cmFileListGeneratorMacProject(&local_208,&this->Names,".app");
      pcVar4 = cmFileList::operator/(pcVar4,&local_208.super_cmFileListGeneratorBase);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"Contents/Resources",&local_259);
      cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_238,&local_258);
      pcVar4 = cmFileList::operator/(pcVar4,&local_238.super_cmFileListGeneratorBase);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"cmake",&local_2b1);
      cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive(&local_290,&local_2b0);
      cmFileList::operator/(pcVar4,&local_290.super_cmFileListGeneratorBase);
      cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive(&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_208);
      cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_180);
      if (lister_1.UseSuffixes) {
        this_local._7_1_ = 1;
      }
      lister_1._33_3_ = 0;
      cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_180);
      if (lister_1._32_4_ == 0) {
        this_local._7_1_ = 0;
        lister_1.UseSuffixes = true;
        lister_1._33_3_ = 0;
      }
    }
    std::__cxx11::string::~string((string *)&lister.UseSuffixes);
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("!prefix_in.empty() && prefix_in.back() == \'/\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFindPackageCommand.cxx"
                ,0x8e1,"bool cmFindPackageCommand::SearchAppBundlePrefix(const std::string &)");
}

Assistant:

bool cmFindPackageCommand::SearchAppBundlePrefix(std::string const& prefix_in)
{
  assert(!prefix_in.empty() && prefix_in.back() == '/');
  if (this->DebugMode) {
    fprintf(stderr, "Checking bundle prefix [%s]\n", prefix_in.c_str());
  }

  // Strip the trailing slash because the path generator is about to
  // add one.
  std::string prefix = prefix_in.substr(0, prefix_in.size() - 1);

  // <prefix>/Foo.app/Contents/Resources
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".app") /
      cmFileListGeneratorFixed("Contents/Resources");
    if (lister.Search()) {
      return true;
    }
  }

  // <prefix>/Foo.app/Contents/Resources/CMake
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".app") /
      cmFileListGeneratorFixed("Contents/Resources") /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  return false;
}